

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

String * __thiscall cm::String::erase(String *this,size_type index,size_type count)

{
  size_type sVar1;
  out_of_range *this_00;
  unsigned_long *puVar2;
  char *pcVar3;
  type pSVar4;
  undefined1 local_68 [8];
  string s;
  size_type rindex;
  unsigned_long local_38;
  size_type rcount;
  size_type local_20;
  size_type count_local;
  size_type index_local;
  String *this_local;
  
  local_20 = count;
  count_local = index;
  index_local = (size_type)this;
  sVar1 = size(this);
  if (sVar1 < index) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Index out of range in String::erase");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar1 = size(this);
  rindex = sVar1 - count_local;
  puVar2 = std::min<unsigned_long>(&local_20,&rindex);
  local_38 = *puVar2;
  s.field_2._8_8_ = count_local + local_38;
  std::__cxx11::string::string((string *)local_68);
  size(this);
  std::__cxx11::string::reserve((ulong)local_68);
  pcVar3 = data(this);
  std::__cxx11::string::assign(local_68,(ulong)pcVar3);
  pcVar3 = data(this);
  pcVar3 = pcVar3 + s.field_2._8_8_;
  size(this);
  std::__cxx11::string::append(local_68,(ulong)pcVar3);
  pSVar4 = operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
  std::__cxx11::string::~string((string *)local_68);
  return pSVar4;
}

Assistant:

String& String::erase(size_type index, size_type count)
{
  if (index > this->size()) {
    throw std::out_of_range("Index out of range in String::erase");
  }
  size_type const rcount = std::min(count, this->size() - index);
  size_type const rindex = index + rcount;
  std::string s;
  s.reserve(this->size() - rcount);
  s.assign(this->data(), index);
  s.append(this->data() + rindex, this->size() - rindex);
  return *this = std::move(s);
}